

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  stbi_uc *psVar10;
  char *pcVar11;
  long lVar12;
  byte *pbVar13;
  int iVar14;
  stbi__uint32 sVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  stbi_uc *psVar19;
  ulong uVar20;
  uint uVar21;
  byte bVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  byte *pbVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long in_FS_OFFSET;
  bool bVar32;
  stbi_uc *local_e8;
  stbi_uc *local_d0;
  byte *local_c8;
  ulong local_78;
  ulong uVar22;
  
  bVar32 = depth == 0x10;
  uVar5 = x * out_n;
  uVar6 = uVar5 << bVar32;
  a_00 = a->s->img_n;
  uVar7 = a_00 << bVar32;
  iVar14 = a_00 + 1;
  if (iVar14 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                  ,0x11c8,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar10 = (stbi_uc *)
            stbi__malloc_mad3(x,y,out_n << bVar32,
                              CONCAT31((int3)((uint)iVar14 >> 8),iVar14 == out_n || a_00 == out_n));
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    pcVar11 = "outofmem";
  }
  else {
    iVar8 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar8 == 0) {
      pcVar11 = "too large";
    }
    else {
      uVar9 = a_00 * x;
      uVar21 = uVar9 * depth + 7 >> 3;
      uVar22 = (ulong)uVar21;
      if ((uVar21 + 1) * y <= raw_len) {
        lVar12 = (long)a_00;
        lVar25 = (long)(out_n << bVar32);
        lVar26 = -lVar25;
        lVar29 = -(ulong)uVar6;
        uVar24 = 0;
        uVar31 = 0;
        local_78 = (ulong)x;
        do {
          if (uVar31 == y) {
            if (7 < depth) {
              if (depth != 0x10) {
                return 1;
              }
              psVar10 = a->out;
              for (lVar12 = 0; uVar5 * y != (int)lVar12; lVar12 = lVar12 + 1) {
                puVar1 = (ushort *)(psVar10 + lVar12 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
              return 1;
            }
            uVar7 = 0;
            uVar31 = 0;
            do {
              if (uVar31 == y) {
                return 1;
              }
              bVar4 = 1;
              if (color == 0) {
                bVar4 = ""[depth];
              }
              uVar20 = (ulong)uVar7;
              psVar10 = a->out;
              uVar18 = (ulong)(uVar6 * (int)uVar31);
              if (depth == 4) {
                lVar12 = (uVar5 - uVar22) + uVar20;
                lVar25 = 0;
                for (uVar21 = uVar9; 1 < (int)uVar21; uVar21 = uVar21 - 2) {
                  psVar10[lVar25 * 2 + uVar20] = (psVar10[lVar25 + lVar12] >> 4) * bVar4;
                  psVar10[lVar25 * 2 + uVar20 + 1] = (psVar10[lVar25 + lVar12] & 0xf) * bVar4;
                  lVar25 = lVar25 + 1;
                }
                if (uVar21 == 1) {
                  psVar10[lVar25 * 2 + uVar20] = (psVar10[lVar25 + lVar12] >> 4) * bVar4;
                }
              }
              else {
                pbVar27 = psVar10 + ((uVar5 + uVar18) - uVar22);
                if (depth == 2) {
                  psVar10 = psVar10 + uVar20 + 3;
                  for (uVar21 = uVar9; 3 < (int)uVar21; uVar21 = uVar21 - 4) {
                    psVar10[-3] = (*pbVar27 >> 6) * bVar4;
                    psVar10[-2] = (*pbVar27 >> 4 & 3) * bVar4;
                    psVar10[-1] = (*pbVar27 >> 2 & 3) * bVar4;
                    *psVar10 = (*pbVar27 & 3) * bVar4;
                    pbVar27 = pbVar27 + 1;
                    psVar10 = psVar10 + 4;
                  }
                  if (((0 < (int)uVar21) && (psVar10[-3] = (*pbVar27 >> 6) * bVar4, uVar21 != 1)) &&
                     (psVar10[-2] = (*pbVar27 >> 4 & 3) * bVar4, uVar21 == 3)) {
                    psVar10[-1] = (*pbVar27 >> 2 & 3) * bVar4;
                  }
                }
                else if (depth == 1) {
                  pbVar13 = psVar10 + uVar20 + 7;
                  for (uVar21 = uVar9; 7 < (int)uVar21; uVar21 = uVar21 - 8) {
                    pbVar13[-7] = (char)*pbVar27 >> 7 & bVar4;
                    pbVar13[-6] = (char)(*pbVar27 * '\x02') >> 7 & bVar4;
                    pbVar13[-5] = (char)(*pbVar27 << 2) >> 7 & bVar4;
                    pbVar13[-4] = (char)(*pbVar27 << 3) >> 7 & bVar4;
                    pbVar13[-3] = (char)(*pbVar27 << 4) >> 7 & bVar4;
                    pbVar13[-2] = (char)(*pbVar27 << 5) >> 7 & bVar4;
                    pbVar13[-1] = (char)(*pbVar27 << 6) >> 7 & bVar4;
                    bVar23 = bVar4;
                    if ((*pbVar27 & 1) == 0) {
                      bVar23 = 0;
                    }
                    *pbVar13 = bVar23;
                    pbVar27 = pbVar27 + 1;
                    pbVar13 = pbVar13 + 8;
                  }
                  if (((((0 < (int)uVar21) &&
                        (pbVar13[-7] = (char)*pbVar27 >> 7 & bVar4, uVar21 != 1)) &&
                       ((pbVar13[-6] = (char)(*pbVar27 * '\x02') >> 7 & bVar4, 2 < uVar21 &&
                        ((pbVar13[-5] = (char)(*pbVar27 << 2) >> 7 & bVar4, uVar21 != 3 &&
                         (pbVar13[-4] = (char)(*pbVar27 << 3) >> 7 & bVar4, 4 < uVar21)))))) &&
                      (pbVar13[-3] = (char)(*pbVar27 << 4) >> 7 & bVar4, uVar21 != 5)) &&
                     (pbVar13[-2] = (char)(*pbVar27 << 5) >> 7 & bVar4, uVar21 == 7)) {
                    pbVar13[-1] = (char)(*pbVar27 << 6) >> 7 & bVar4;
                  }
                }
              }
              if (a_00 != out_n) {
                psVar10 = a->out;
                if (a_00 == 1) {
                  uVar21 = x * 2 - 1;
                  for (iVar14 = 0; -1 < (int)((x - 1) + iVar14); iVar14 = iVar14 + -1) {
                    psVar10[uVar21 + uVar18] = 0xff;
                    psVar10[(uVar21 - 1) + uVar18] =
                         psVar10[((x - 1) + iVar14 & 0x7fffffff) + uVar18];
                    uVar21 = uVar21 - 2;
                  }
                }
                else {
                  iVar14 = x - 1;
                  uVar24 = x * 4;
                  uVar21 = x * 3;
                  if (a_00 != 3) {
                    __assert_fail("img_n == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                                  ,0x1275,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  while( true ) {
                    uVar21 = uVar21 - 3;
                    if (iVar14 < 0) break;
                    psVar10[(uVar24 - 1) + uVar18] = 0xff;
                    psVar10[(uVar24 - 2) + uVar18] = psVar10[(ulong)uVar21 + uVar18 + 2];
                    psVar10[(uVar24 - 3) + uVar18] = psVar10[(ulong)uVar21 + uVar18 + 1];
                    psVar10[(uVar24 - 4) + uVar18] = psVar10[uVar21 + uVar18];
                    iVar14 = iVar14 + -1;
                    uVar24 = uVar24 - 4;
                  }
                }
              }
              uVar31 = uVar31 + 1;
              uVar7 = uVar7 + uVar6;
            } while( true );
          }
          uVar18 = (ulong)*raw;
          if (4 < uVar18) {
            pcVar11 = "invalid filter";
            goto LAB_0013e1f9;
          }
          local_e8 = a->out + uVar6 * (int)uVar31;
          if (depth < 8) {
            if (x < uVar21) {
              pcVar11 = "invalid width";
              goto LAB_0013e1f9;
            }
            local_e8 = local_e8 + (uVar5 - uVar21);
            uVar7 = 1;
            local_78 = uVar22;
          }
          if (uVar31 == 0) {
            uVar18 = (ulong)""[uVar18];
          }
          uVar20 = 0;
          if (0 < (int)uVar7) {
            uVar20 = (ulong)uVar7;
          }
          for (uVar30 = 0; uVar20 != uVar30; uVar30 = uVar30 + 1) {
            switch(uVar18) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar4 = raw[uVar30 + 1];
              break;
            case 2:
              bVar4 = local_e8[uVar30 + lVar29];
              goto LAB_0013d8c5;
            case 3:
              bVar4 = local_e8[uVar30 + lVar29] >> 1;
LAB_0013d8c5:
              bVar4 = bVar4 + raw[uVar30 + 1];
              break;
            case 4:
              bVar4 = raw[uVar30 + 1];
              iVar8 = stbi__paeth(0,(uint)local_e8[uVar30 + lVar29],0);
              bVar4 = (char)iVar8 + bVar4;
              break;
            default:
              goto switchD_0013d87f_default;
            }
            local_e8[uVar30] = bVar4;
switchD_0013d87f_default:
          }
          lVar16 = (long)(int)uVar7;
          if (depth == 8) {
            lVar17 = (long)out_n;
            lVar2 = lVar12;
            if (a_00 != out_n) {
              local_e8[lVar12] = 0xff;
            }
LAB_0013d93f:
            local_c8 = raw + lVar2 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar17 = lVar25;
              lVar2 = lVar16;
              if (a_00 != out_n) {
                local_e8[lVar16] = 0xff;
                local_e8[lVar16 + 1] = 0xff;
              }
              goto LAB_0013d93f;
            }
            local_c8 = raw + 2;
            lVar17 = 1;
          }
          psVar10 = local_e8 + lVar17;
          local_d0 = local_e8 + lVar17 + lVar29;
          if (depth < 8 || a_00 == out_n) {
            uVar28 = ((int)local_78 + -1) * uVar7;
            switch(uVar18) {
            case 0:
              memcpy(psVar10,local_c8,(long)(int)uVar28);
              break;
            case 1:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
                psVar10[uVar18] = psVar10[uVar18 - lVar16] + local_c8[uVar18];
              }
              break;
            case 2:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
                psVar10[uVar18] = psVar10[uVar18 + lVar29] + local_c8[uVar18];
              }
              break;
            case 3:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              uVar18 = (ulong)uVar3;
              pbVar27 = local_c8;
              while (bVar32 = uVar18 != 0, uVar18 = uVar18 - 1, bVar32) {
                *psVar10 = (char)((uint)psVar10[-lVar16] + (uint)psVar10[lVar29] >> 1) + *pbVar27;
                psVar10 = psVar10 + 1;
                pbVar27 = pbVar27 + 1;
              }
              break;
            case 4:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar18 = 0; uVar18 != uVar3; uVar18 = uVar18 + 1) {
                bVar4 = local_c8[uVar18];
                iVar8 = stbi__paeth((uint)psVar10[uVar18 - lVar16],(uint)local_d0[uVar18],
                                    (uint)local_d0[uVar18 - lVar16]);
                psVar10[uVar18] = (char)iVar8 + bVar4;
              }
              break;
            case 5:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
                psVar10[uVar18] = (psVar10[uVar18 - lVar16] >> 1) + local_c8[uVar18];
              }
              break;
            case 6:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
                psVar10[uVar18] = psVar10[uVar18 - lVar16] + local_c8[uVar18];
              }
            }
            local_c8 = local_c8 + (int)uVar28;
          }
          else {
            if (iVar14 != out_n) {
              __assert_fail("img_n+1 == out_n",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                            ,0x121c,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            switch(uVar18) {
            case 0:
              sVar15 = x;
              while (sVar15 = sVar15 - 1, sVar15 != 0) {
                for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
                  psVar10[uVar18] = local_c8[uVar18];
                }
                psVar10[lVar16] = 0xff;
                local_c8 = local_c8 + lVar16;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 1:
              sVar15 = x;
              while (sVar15 = sVar15 - 1, sVar15 != 0) {
                for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
                  psVar10[uVar18] = psVar10[uVar18 + lVar26] + local_c8[uVar18];
                }
                psVar10[lVar16] = 0xff;
                local_c8 = local_c8 + lVar16;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 2:
              sVar15 = x;
              while (sVar15 = sVar15 - 1, sVar15 != 0) {
                for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
                  psVar10[uVar18] = psVar10[uVar18 + lVar29] + local_c8[uVar18];
                }
                psVar10[lVar16] = 0xff;
                local_c8 = local_c8 + lVar16;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 3:
              sVar15 = x;
              while (sVar15 = sVar15 - 1, pbVar27 = local_c8, psVar19 = psVar10, uVar18 = uVar20,
                    sVar15 != 0) {
                while (uVar18 != 0) {
                  *psVar19 = (char)((uint)psVar19[lVar26] + (uint)psVar19[lVar29] >> 1) + *pbVar27;
                  pbVar27 = pbVar27 + 1;
                  psVar19 = psVar19 + 1;
                  uVar18 = uVar18 - 1;
                }
                psVar10[lVar16] = 0xff;
                local_c8 = local_c8 + lVar16;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 4:
              psVar19 = local_e8 + lVar17 + lVar26;
              local_e8 = local_e8 + lVar17 + (lVar26 - (ulong)uVar6);
              sVar15 = x;
              while (sVar15 = sVar15 - 1, sVar15 != 0) {
                for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
                  bVar4 = local_c8[uVar18];
                  iVar8 = stbi__paeth((uint)psVar19[uVar18],(uint)local_d0[uVar18],
                                      (uint)local_e8[uVar18]);
                  psVar10[uVar18] = (char)iVar8 + bVar4;
                }
                psVar10[lVar16] = 0xff;
                local_c8 = local_c8 + lVar16;
                psVar10 = psVar10 + lVar25;
                local_d0 = local_d0 + lVar25;
                psVar19 = psVar19 + lVar25;
                local_e8 = local_e8 + lVar25;
              }
              break;
            case 5:
              sVar15 = x;
              while (sVar15 = sVar15 - 1, sVar15 != 0) {
                for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
                  psVar10[uVar18] = (psVar10[uVar18 + lVar26] >> 1) + local_c8[uVar18];
                }
                psVar10[lVar16] = 0xff;
                local_c8 = local_c8 + lVar16;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 6:
              sVar15 = x;
              while (sVar15 = sVar15 - 1, sVar15 != 0) {
                for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
                  psVar10[uVar18] = psVar10[uVar18 + lVar26] + local_c8[uVar18];
                }
                psVar10[lVar16] = 0xff;
                local_c8 = local_c8 + lVar16;
                psVar10 = psVar10 + lVar25;
              }
            }
            if (depth == 0x10) {
              psVar10 = a->out + (long)(int)(uVar7 + 1) + (ulong)uVar24;
              sVar15 = x;
              while (bVar32 = sVar15 != 0, sVar15 = sVar15 - 1, bVar32) {
                *psVar10 = 0xff;
                psVar10 = psVar10 + lVar25;
              }
            }
          }
          uVar31 = uVar31 + 1;
          uVar24 = uVar24 + uVar6;
          raw = local_c8;
        } while( true );
      }
      pcVar11 = "not enough pixels";
    }
  }
LAB_0013e1f9:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar11;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }